

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::store_flattened_struct
          (CompilerGLSL *this,string *basename,uint32_t rhs_id,SPIRType *type,
          SmallVector<unsigned_int,_8UL> *indices)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined8 this_00;
  uint32_t uVar3;
  uint *puVar4;
  TypedID *pTVar5;
  size_t sVar6;
  SPIRType *pSVar7;
  string local_148;
  string local_128;
  undefined1 local_108 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> rhs;
  undefined1 local_c8 [8];
  string lhs;
  uint32_t i;
  uint *index;
  uint *__end1;
  uint *__begin1;
  SmallVector<unsigned_int,_8UL> *__range1;
  SPIRType *member_type;
  undefined1 local_68 [8];
  SmallVector<unsigned_int,_8UL> sub_indices;
  SmallVector<unsigned_int,_8UL> *indices_local;
  SPIRType *type_local;
  uint32_t rhs_id_local;
  string *basename_local;
  CompilerGLSL *this_local;
  
  sub_indices.stack_storage.aligned_char._24_8_ = indices;
  SmallVector<unsigned_int,_8UL>::SmallVector((SmallVector<unsigned_int,_8UL> *)local_68,indices);
  member_type._4_4_ = 0;
  SmallVector<unsigned_int,_8UL>::push_back
            ((SmallVector<unsigned_int,_8UL> *)local_68,(uint *)((long)&member_type + 4));
  this_00 = sub_indices.stack_storage.aligned_char._24_8_;
  __end1 = VectorView<unsigned_int>::begin
                     ((VectorView<unsigned_int> *)sub_indices.stack_storage.aligned_char._24_8_);
  puVar4 = VectorView<unsigned_int>::end((VectorView<unsigned_int> *)this_00);
  __range1 = (SmallVector<unsigned_int,_8UL> *)type;
  for (; __end1 != puVar4; __end1 = __end1 + 1) {
    pTVar5 = (TypedID *)
             VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                       ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                        &__range1[2].stack_storage,(ulong)*__end1);
    uVar3 = TypedID::operator_cast_to_unsigned_int(pTVar5);
    __range1 = (SmallVector<unsigned_int,_8UL> *)
               Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar3);
  }
  lhs.field_2._8_4_ = 0;
  while( true ) {
    uVar1 = lhs.field_2._8_4_;
    sVar6 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                      ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                       &__range1[2].stack_storage);
    uVar2 = lhs.field_2._8_4_;
    if ((uint)sVar6 <= (uint)uVar1) break;
    puVar4 = VectorView<unsigned_int>::back((VectorView<unsigned_int> *)local_68);
    *puVar4 = uVar2;
    to_member_name_abi_cxx11_
              ((string *)((long)&rhs.field_2 + 8),this,(SPIRType *)__range1,lhs.field_2._8_4_);
    join<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string>
              ((string *)local_c8,(spirv_cross *)basename,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x66305e,
               (char (*) [2])((long)&rhs.field_2 + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)indices);
    ::std::__cxx11::string::~string((string *)(rhs.field_2._M_local_buf + 8));
    ParsedIR::sanitize_underscores((string *)local_c8);
    pTVar5 = (TypedID *)
             VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                       ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                        &__range1[2].stack_storage,(ulong)(uint)lhs.field_2._8_4_);
    uVar3 = TypedID::operator_cast_to_unsigned_int(pTVar5);
    pSVar7 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar3);
    if (pSVar7->basetype == Struct) {
      indices = (SmallVector<unsigned_int,_8UL> *)local_68;
      store_flattened_struct(this,(string *)local_c8,rhs_id,type,indices);
    }
    else {
      to_expression_abi_cxx11_(&local_128,this,rhs_id,true);
      to_multi_member_reference_abi_cxx11_
                (&local_148,this,type,(SmallVector<unsigned_int,_8UL> *)local_68);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_108,&local_128,&local_148);
      ::std::__cxx11::string::~string((string *)&local_148);
      ::std::__cxx11::string::~string((string *)&local_128);
      indices = (SmallVector<unsigned_int,_8UL> *)0x6815db;
      statement<std::__cxx11::string&,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                 (char (*) [4])0x6766c4,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                 (char (*) [2])0x6815db);
      ::std::__cxx11::string::~string((string *)local_108);
    }
    ::std::__cxx11::string::~string((string *)local_c8);
    lhs.field_2._8_4_ = lhs.field_2._8_4_ + 1;
  }
  SmallVector<unsigned_int,_8UL>::~SmallVector((SmallVector<unsigned_int,_8UL> *)local_68);
  return;
}

Assistant:

void CompilerGLSL::store_flattened_struct(const string &basename, uint32_t rhs_id, const SPIRType &type,
                                          const SmallVector<uint32_t> &indices)
{
	SmallVector<uint32_t> sub_indices = indices;
	sub_indices.push_back(0);

	auto *member_type = &type;
	for (auto &index : indices)
		member_type = &get<SPIRType>(member_type->member_types[index]);

	for (uint32_t i = 0; i < uint32_t(member_type->member_types.size()); i++)
	{
		sub_indices.back() = i;
		auto lhs = join(basename, "_", to_member_name(*member_type, i));
		ParsedIR::sanitize_underscores(lhs);

		if (get<SPIRType>(member_type->member_types[i]).basetype == SPIRType::Struct)
		{
			store_flattened_struct(lhs, rhs_id, type, sub_indices);
		}
		else
		{
			auto rhs = to_expression(rhs_id) + to_multi_member_reference(type, sub_indices);
			statement(lhs, " = ", rhs, ";");
		}
	}
}